

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

void ly_out_free(ly_out *out,_func_void_void_ptr *clb_arg_destructor,ly_bool destroy)

{
  int __fd;
  
  if (out == (ly_out *)0x0) {
    return;
  }
  switch(out->type) {
  case LY_OUT_FD:
    if (destroy == '\0') break;
    __fd = (out->method).fd;
    goto LAB_0013af7e;
  case LY_OUT_FDSTREAM:
    fclose((FILE *)(out->method).f);
    if (destroy == '\0') break;
    __fd = (out->method).fdstream.fd;
LAB_0013af7e:
    close(__fd);
    break;
  case LY_OUT_FILE:
    if (destroy == '\0') break;
    goto LAB_0013af6b;
  case LY_OUT_FILEPATH:
    free((out->method).clb.arg);
LAB_0013af6b:
    fclose((FILE *)(out->method).f);
    break;
  case LY_OUT_MEMORY:
    if (destroy != '\0') {
      free(*(out->method).mem.buf);
    }
    break;
  case LY_OUT_CALLBACK:
    if (clb_arg_destructor != (_func_void_void_ptr *)0x0) {
      (*clb_arg_destructor)((out->method).clb.arg);
    }
    break;
  case LY_OUT_ERROR:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x1ad);
  }
  free(out->buffered);
  free(out);
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_out_free(struct ly_out *out, void (*clb_arg_destructor)(void *arg), ly_bool destroy)
{
    if (!out) {
        return;
    }

    switch (out->type) {
    case LY_OUT_CALLBACK:
        if (clb_arg_destructor) {
            clb_arg_destructor(out->method.clb.arg);
        }
        break;
    case LY_OUT_FDSTREAM:
        fclose(out->method.fdstream.f);
        if (destroy) {
            close(out->method.fdstream.fd);
        }
        break;
    case LY_OUT_FD:
        if (destroy) {
            close(out->method.fd);
        }
        break;
    case LY_OUT_FILE:
        if (destroy) {
            fclose(out->method.f);
        }
        break;
    case LY_OUT_MEMORY:
        if (destroy) {
            free(*out->method.mem.buf);
        }
        break;
    case LY_OUT_FILEPATH:
        free(out->method.fpath.filepath);
        fclose(out->method.fpath.f);
        break;
    case LY_OUT_ERROR:
        LOGINT(NULL);
    }

    free(out->buffered);
    free(out);
}